

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall Clasp::mt::ParallelSolve::SharedData::SharedData(SharedData *this)

{
  Potassco::StringBuilder::StringBuilder(&this->msg);
  ScheduleStrategy::ScheduleStrategy(&this->globalR,Geometric,100,1.5,0);
  this->path = (LitVec *)0x0;
  (this->generator).ptr_ = 0;
  (this->syncT).start_ = 0.0;
  (this->syncT).split_ = 0.0;
  (this->syncT).total_ = 0.0;
  (this->modelM).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->modelM).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->modelM).super___mutex_base._M_mutex + 0x10) = 0;
  (this->modelM).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->modelM).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->workM).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->workM).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->workM).super___mutex_base._M_mutex + 0x10) = 0;
  (this->workM).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->workM).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->workCond).super_condition_variable);
  (this->workQ).qFront = 0;
  (this->workQ).vec.ebo_.buf = (pointer)0x0;
  (this->workQ).vec.ebo_.size = 0;
  (this->workQ).vec.ebo_.cap = 0;
  (this->lower).level = 0;
  (this->lower).bound = -0x8000000000000000;
  reset(this,(SharedContext *)0x0);
  LOCK();
  (this->control).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

SharedData() : path(0) { reset(0); control = 0; }